

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O1

bool __thiscall
cmAddLibraryCommand::InitialPass
          (cmAddLibraryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  pointer pbVar5;
  bool bVar6;
  int iVar7;
  PolicyStatus PVar8;
  int iVar9;
  char *pcVar10;
  undefined8 uVar11;
  long lVar12;
  ostream *poVar13;
  cmState *this_00;
  cmGlobalGenerator *pcVar14;
  long *plVar15;
  cmTarget *pcVar16;
  size_type *psVar17;
  PolicyID id;
  MessageType t;
  _Alloc_hider _Var18;
  pointer pbVar19;
  TargetType type;
  string libType;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srclists;
  string local_230;
  string local_210;
  uint local_1ec;
  pointer local_1e8;
  uint local_1e0;
  uint local_1dc;
  uint local_1d8;
  uint local_1d4;
  undefined1 local_1d0 [112];
  ios_base local_160 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1d0._0_8_ = local_1d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d0,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1d0);
    if ((undefined1 *)local_1d0._0_8_ == local_1d0 + 0x10) {
      return false;
    }
    goto LAB_003b9ff4;
  }
  pcVar2 = (this->super_cmCommand).Makefile;
  local_1d0._0_8_ = local_1d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"BUILD_SHARED_LIBS","");
  pcVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_1d0);
  bVar6 = cmSystemTools::IsOff(pcVar10);
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
  }
  type = SHARED_LIBRARY - bVar6;
  local_1e8 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  pbVar19 = local_1e8 + 1;
  local_1d8 = 0;
  local_1ec = 0;
  local_1d4 = 0;
  local_1e0 = 0;
  local_1dc = 0;
  do {
    if (pbVar19 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) goto LAB_003b99b9;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    pcVar3 = (pbVar19->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,pcVar3,pcVar3 + pbVar19->_M_string_length);
    uVar11 = std::__cxx11::string::compare((char *)&local_210);
    if ((int)uVar11 == 0) {
      if (type == INTERFACE_LIBRARY) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"INTERFACE library specified with conflicting STATIC type.",
                   0x39);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_230);
        goto LAB_003b9846;
      }
      type = STATIC_LIBRARY;
LAB_003b979a:
      pbVar19 = pbVar19 + 1;
      iVar9 = 0;
      local_1ec = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
    }
    else {
      uVar11 = std::__cxx11::string::compare((char *)&local_210);
      if ((int)uVar11 == 0) {
        if (type != INTERFACE_LIBRARY) {
          type = SHARED_LIBRARY;
          goto LAB_003b979a;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"INTERFACE library specified with conflicting SHARED type.",
                   0x39);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_230);
LAB_003b9846:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
        type = INTERFACE_LIBRARY;
      }
      else {
        uVar11 = std::__cxx11::string::compare((char *)&local_210);
        if ((int)uVar11 == 0) {
          if (type != INTERFACE_LIBRARY) {
            type = MODULE_LIBRARY;
            goto LAB_003b979a;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     "INTERFACE library specified with conflicting MODULE type.",0x39);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_230);
          goto LAB_003b9846;
        }
        uVar11 = std::__cxx11::string::compare((char *)&local_210);
        if ((int)uVar11 == 0) {
          if (type != INTERFACE_LIBRARY) {
            type = OBJECT_LIBRARY;
            goto LAB_003b979a;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     "INTERFACE library specified with conflicting OBJECT type.",0x39);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_230);
          goto LAB_003b9846;
        }
        uVar11 = std::__cxx11::string::compare((char *)&local_210);
        if ((int)uVar11 == 0) {
          if (type != INTERFACE_LIBRARY) {
            type = UNKNOWN_LIBRARY;
            goto LAB_003b979a;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     "INTERFACE library specified with conflicting UNKNOWN type.",0x3a);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_230);
          goto LAB_003b9846;
        }
        uVar11 = std::__cxx11::string::compare((char *)&local_210);
        if ((int)uVar11 == 0) {
          if (type != INTERFACE_LIBRARY) {
            pbVar19 = pbVar19 + 1;
            iVar9 = 0;
            local_1d4 = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
            goto LAB_003b9889;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,"INTERFACE library specified with conflicting ALIAS type."
                     ,0x38);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_230);
          goto LAB_003b9846;
        }
        uVar11 = std::__cxx11::string::compare((char *)&local_210);
        if ((int)uVar11 != 0) {
          uVar11 = std::__cxx11::string::compare((char *)pbVar19);
          if ((int)uVar11 == 0) {
            if (type == INTERFACE_LIBRARY) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,
                         "INTERFACE library may not be used with EXCLUDE_FROM_ALL.",0x38);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_230);
              goto LAB_003b9846;
            }
            local_1dc = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
          }
          else {
            uVar11 = std::__cxx11::string::compare((char *)pbVar19);
            if ((int)uVar11 != 0) {
              if (((local_1e0 & 1) == 0) ||
                 (uVar11 = std::__cxx11::string::compare((char *)pbVar19), (int)uVar11 != 0)) {
                iVar9 = 3;
                if ((type == INTERFACE_LIBRARY) &&
                   (iVar7 = std::__cxx11::string::compare((char *)pbVar19), iVar7 == 0)) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,
                             "GLOBAL option may only be used with IMPORTED libraries.",0x37);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_230);
                  goto LAB_003b9846;
                }
              }
              else {
                pbVar19 = pbVar19 + 1;
                iVar9 = 0;
                local_1d8 = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
              }
              goto LAB_003b9889;
            }
            local_1e0 = (uint)CONCAT71((int7)((ulong)uVar11 >> 8),1);
          }
          pbVar19 = pbVar19 + 1;
          iVar9 = 0;
          goto LAB_003b9889;
        }
        if ((local_1ec & 1) == 0) {
          if ((local_1d4 & 1) == 0) {
            if ((local_1dc & 1) == 0) {
              type = INTERFACE_LIBRARY;
              goto LAB_003b979a;
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,
                       "INTERFACE library may not be used with EXCLUDE_FROM_ALL.",0x38);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_230);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1d0,
                       "INTERFACE library specified with conflicting ALIAS type.",0x38);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_230);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     "INTERFACE library specified with conflicting/multiple types.",0x3c);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_230);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
        std::ios_base::~ios_base(local_160);
      }
      iVar9 = 1;
    }
LAB_003b9889:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
  } while (iVar9 == 0);
  if (iVar9 != 3) {
    return false;
  }
LAB_003b99b9:
  pbVar5 = local_1e8;
  if (type != INTERFACE_LIBRARY) {
LAB_003b9a83:
    bVar6 = cmGeneratorExpression::IsValidTargetName(local_1e8);
    if (bVar6) {
      bVar6 = cmGlobalGenerator::IsReservedTarget(pbVar5);
      bVar6 = !bVar6;
    }
    else {
      bVar6 = false;
    }
    if (((bVar6) && ((local_1e0 & 1) == 0)) && ((local_1d4 & 1) == 0)) {
      lVar12 = std::__cxx11::string::find((char)local_1e8,0x3a);
      bVar6 = lVar12 == -1;
    }
    if (!bVar6) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
      PVar8 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0037);
      if (PVar8 - NEW < 3) {
        t = FATAL_ERROR;
        bVar4 = true;
        bVar6 = true;
      }
      else {
        bVar4 = false;
        t = AUTHOR_WARNING;
        bVar6 = false;
        if ((PVar8 == WARN) && (bVar4 = false, type != INTERFACE_LIBRARY)) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_210,(cmPolicies *)0x25,id);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1d0,local_210._M_dataplus._M_p,
                               local_210._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          bVar6 = true;
          bVar4 = false;
          t = AUTHOR_WARNING;
        }
      }
      if (bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"The target name \"",0x11);
        poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,(local_1e8->_M_dataplus)._M_p,
                             local_1e8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar13,
                   "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
                   ,0x7b);
        pcVar2 = (this->super_cmCommand).Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,t,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if (bVar4) goto LAB_003b9c05;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
      std::ios_base::~ios_base(local_160);
    }
    pbVar5 = local_1e8;
    if ((local_1d4 & 1) == 0) {
      if (((local_1e0 & 1) == 0) || ((local_1dc & 1) == 0)) {
        if ((type & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
          this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_210,"TARGET_SUPPORTS_SHARED_LIBS","");
          bVar6 = cmState::GetGlobalPropertyAsBool(this_00,&local_210);
          bVar6 = !bVar6;
        }
        else {
          bVar6 = false;
        }
        paVar1 = &local_230.field_2;
        if (((type & ~STATIC_LIBRARY) == SHARED_LIBRARY) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2)) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        if (bVar6) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,"ADD_LIBRARY called with ",0x18);
          pcVar10 = "MODULE";
          if (type == SHARED_LIBRARY) {
            pcVar10 = "SHARED";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,pcVar10,6);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,
                     " option but the target platform does not support dynamic linking. Building a STATIC library instead. This may lead to problems."
                     ,0x7f);
          pcVar2 = (this->super_cmCommand).Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != paVar1) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
          std::ios_base::~ios_base(local_160);
          type = STATIC_LIBRARY;
        }
        if ((local_1e0 & 1) == 0) {
          if (type == UNKNOWN_LIBRARY) {
            pcVar2 = (this->super_cmCommand).Makefile;
            local_1d0._0_8_ = local_1d0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1d0,
                       "The UNKNOWN library type may be used only for IMPORTED libraries.","");
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_1d0);
LAB_003b9f50:
            if ((undefined1 *)local_1d0._0_8_ == local_1d0 + 0x10) {
              return true;
            }
            operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
            return true;
          }
          local_1d0._0_8_ = local_1d0 + 0x10;
          local_1d0._8_8_ = 0;
          local_1d0[0x10] = '\0';
          bVar6 = cmMakefile::EnforceUniqueName
                            ((this->super_cmCommand).Makefile,local_1e8,(string *)local_1d0,false);
          if (bVar6) {
            if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
              operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1
                             );
            }
          }
          else {
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1d0);
            if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
              operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1
                             );
            }
            if (!bVar6) {
              return false;
            }
          }
          pbVar5 = local_1e8;
          local_58._M_dataplus._M_p = (pointer)0x0;
          local_58._M_string_length = 0;
          local_58.field_2._M_allocated_capacity = 0;
          if (type == INTERFACE_LIBRARY) {
            bVar6 = cmGeneratorExpression::IsValidTargetName(local_1e8);
            if ((!bVar6) ||
               (lVar12 = std::__cxx11::string::find((char *)pbVar5,0x6308fe,0), lVar12 != -1)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,"Invalid name for INTERFACE library target: ",0x2b);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_230);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != paVar1) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
              std::ios_base::~ios_base(local_160);
              bVar6 = false;
              goto LAB_003ba28e;
            }
            type = INTERFACE_LIBRARY;
          }
          else {
            if (pbVar19 ==
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              local_1d0._0_8_ = local_1d0 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1d0,"You have called ADD_LIBRARY for library ","");
              std::__cxx11::string::_M_append
                        (local_1d0,
                         (ulong)(((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
              std::__cxx11::string::append(local_1d0);
              std::__cxx11::string::append(local_1d0);
              cmSystemTools::Message((char *)local_1d0._0_8_,"Warning");
              if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
                operator_delete((void *)local_1d0._0_8_,
                                CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
              }
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_58,local_58._M_string_length,pbVar19,
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
          }
          bVar6 = true;
          cmMakefile::AddLibrary
                    ((this->super_cmCommand).Makefile,local_1e8,type,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_58,(bool)((byte)local_1dc & 1));
LAB_003ba28e:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_58);
          return bVar6;
        }
        if ((local_1ec & 1) == 0) {
          local_1d0._0_8_ = local_1d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"called with IMPORTED argument but no library type.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1d0);
          goto LAB_003b9fe5;
        }
        if (type == INTERFACE_LIBRARY) {
          bVar6 = cmGeneratorExpression::IsValidTargetName(local_1e8);
          if (bVar6) goto LAB_003ba588;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,"Invalid name for IMPORTED INTERFACE library target: ",
                     0x34);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,(local_1e8->_M_dataplus)._M_p,local_1e8->_M_string_length)
          ;
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_230);
        }
        else {
          if (type == OBJECT_LIBRARY) {
            local_1d0._0_8_ = local_1d0 + 0x10;
            local_1d0._8_8_ = 0;
            local_1d0[0x10] = '\0';
            pcVar14 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
            iVar9 = (*pcVar14->_vptr_cmGlobalGenerator[0x20])(pcVar14,local_1d0);
            if ((char)iVar9 == '\0') {
              pcVar2 = (this->super_cmCommand).Makefile;
              std::operator+(&local_58,
                             "The OBJECT library type may not be used for IMPORTED libraries",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d0);
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_58);
              psVar17 = (size_type *)(plVar15 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar17) {
                local_230.field_2._M_allocated_capacity = *psVar17;
                local_230.field_2._8_8_ = plVar15[3];
                local_230._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_230.field_2._M_allocated_capacity = *psVar17;
                local_230._M_dataplus._M_p = (pointer)*plVar15;
              }
              local_230._M_string_length = plVar15[1];
              *plVar15 = (long)psVar17;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_230);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != paVar1) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
              operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1
                             );
            }
            if ((char)iVar9 == '\0') {
              return true;
            }
          }
LAB_003ba588:
          pbVar19 = local_1e8;
          pcVar16 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,local_1e8,false);
          if (pcVar16 == (cmTarget *)0x0) {
            cmMakefile::AddImportedTarget
                      ((this->super_cmCommand).Makefile,pbVar19,type,(bool)((byte)local_1d8 & 1));
            return true;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1d0,"cannot create imported target \"",0x1f);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1d0,(local_1e8->_M_dataplus)._M_p,
                               local_1e8->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar13,"\" because another target with the same name already exists.",0x3b);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_230);
        }
        local_210.field_2._M_allocated_capacity = local_230.field_2._M_allocated_capacity;
        _Var18._M_p = local_230._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p == paVar1) goto LAB_003b9c05;
        goto LAB_003b9a23;
      }
      local_1d0._0_8_ = local_1d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d0,"excludeFromAll with IMPORTED target makes no sense.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1d0);
    }
    else {
      bVar6 = cmGeneratorExpression::IsValidTargetName(local_1e8);
      if (bVar6) {
        if ((local_1dc & 1) == 0) {
          if (((local_1e0 & 1) == 0) && ((local_1d8 & 1) == 0)) {
            if ((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start == 0x60) {
              pcVar10 = (pbVar19->_M_dataplus)._M_p;
              pcVar2 = (this->super_cmCommand).Makefile;
              std::__cxx11::string::string((string *)local_1d0,pcVar10,(allocator *)&local_210);
              bVar6 = cmMakefile::IsAlias(pcVar2,(string *)local_1d0);
              if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
                operator_delete((void *)local_1d0._0_8_,
                                CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
              }
              if (bVar6) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1d0,"cannot create ALIAS target \"",0x1c);
                poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1d0,(local_1e8->_M_dataplus)._M_p,
                                     local_1e8->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,"\" because target \"",0x12);
                poVar13 = std::operator<<(poVar13,pcVar10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar13,"\" is itself an ALIAS.",0x15);
                std::__cxx11::stringbuf::str();
                cmCommand::SetError(&this->super_cmCommand,&local_210);
              }
              else {
                pcVar2 = (this->super_cmCommand).Makefile;
                std::__cxx11::string::string((string *)local_1d0,pcVar10,(allocator *)&local_210);
                pcVar16 = cmMakefile::FindTargetToUse(pcVar2,(string *)local_1d0,true);
                if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
                  operator_delete((void *)local_1d0._0_8_,
                                  CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
                }
                if (pcVar16 == (cmTarget *)0x0) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,"cannot create ALIAS target \"",0x1c);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d0,(local_1e8->_M_dataplus)._M_p,
                                       local_1e8->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,"\" because target \"",0x12);
                  poVar13 = std::operator<<(poVar13,pcVar10);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,"\" does not already exist.",0x19);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_210);
                }
                else if ((pcVar16->TargetTypeValue - STATIC_LIBRARY < 4) ||
                        (pcVar16->TargetTypeValue == INTERFACE_LIBRARY)) {
                  if (pcVar16->IsImportedTarget != true) {
                    pcVar2 = (this->super_cmCommand).Makefile;
                    std::__cxx11::string::string
                              ((string *)local_1d0,pcVar10,(allocator *)&local_210);
                    cmMakefile::AddAlias(pcVar2,local_1e8,(string *)local_1d0);
                    goto LAB_003b9f50;
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,"cannot create ALIAS target \"",0x1c);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d0,(local_1e8->_M_dataplus)._M_p,
                                       local_1e8->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,"\" because target \"",0x12);
                  poVar13 = std::operator<<(poVar13,pcVar10);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\" is IMPORTED.",0xe);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_210);
                }
                else {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d0,"cannot create ALIAS target \"",0x1c);
                  poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1d0,(local_1e8->_M_dataplus)._M_p,
                                       local_1e8->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,"\" because target \"",0x12);
                  poVar13 = std::operator<<(poVar13,pcVar10);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar13,"\" is not a library.",0x13);
                  std::__cxx11::stringbuf::str();
                  cmCommand::SetError(&this->super_cmCommand,&local_210);
                }
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1d0,"ALIAS requires exactly one target argument.",0x2b);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_210);
            }
            goto LAB_003b9a0b;
          }
          local_1d0._0_8_ = local_1d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"IMPORTED with ALIAS is not allowed.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1d0);
        }
        else {
          local_1d0._0_8_ = local_1d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1d0,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1d0);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d0,"Invalid name for ALIAS: ",pbVar5);
        cmCommand::SetError(&this->super_cmCommand,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1d0);
      }
    }
LAB_003b9fe5:
    if ((undefined1 *)local_1d0._0_8_ == local_1d0 + 0x10) {
      return false;
    }
LAB_003b9ff4:
    operator_delete((void *)local_1d0._0_8_,CONCAT71(local_1d0._17_7_,local_1d0[0x10]) + 1);
    return false;
  }
  if (pbVar19 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    if (((local_1d8 & 1) == 0) || ((local_1e0 & 1) != 0)) goto LAB_003b9a83;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,"INTERFACE library specified as GLOBAL, but not as IMPORTED.",
               0x3b);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_210);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,"INTERFACE library requires no source arguments.",0x2f);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_210);
  }
LAB_003b9a0b:
  _Var18._M_p = local_210._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p == &local_210.field_2) goto LAB_003b9c05;
LAB_003b9a23:
  operator_delete(_Var18._M_p,local_210.field_2._M_allocated_capacity + 1);
LAB_003b9c05:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d0);
  std::ios_base::~ios_base(local_160);
  return false;
}

Assistant:

bool cmAddLibraryCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmSystemTools::IsOff(
        this->Makefile->GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  std::vector<std::string>::const_iterator s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting STATIC type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting SHARED type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting MODULE type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting OBJECT type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting UNKNOWN type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting/multiple types.";
        this->SetError(e.str());
        return false;
      }
      if (isAlias) {
        std::ostringstream e;
        e << "INTERFACE library specified with conflicting ALIAS type.";
        this->SetError(e.str());
        return false;
      }
      if (excludeFromAll) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        std::ostringstream e;
        e << "INTERFACE library may not be used with EXCLUDE_FROM_ALL.";
        this->SetError(e.str());
        return false;
      }
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      std::ostringstream e;
      e << "GLOBAL option may only be used with IMPORTED libraries.";
      this->SetError(e.str());
      return false;
    } else {
      break;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (s != args.end()) {
      std::ostringstream e;
      e << "INTERFACE library requires no source arguments.";
      this->SetError(e.str());
      return false;
    }
    if (importGlobal && !importTarget) {
      std::ostringstream e;
      e << "INTERFACE library specified as GLOBAL, but not as IMPORTED.";
      this->SetError(e.str());
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk) {
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;
    std::ostringstream e;
    bool issueMessage = false;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0037)) {
      case cmPolicies::WARN:
        if (type != cmStateEnums::INTERFACE_LIBRARY) {
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
          issueMessage = true;
        }
      case cmPolicies::OLD:
        break;
      case cmPolicies::NEW:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        issueMessage = true;
        messageType = cmake::FATAL_ERROR;
    }
    if (issueMessage) {
      e << "The target name \"" << libName
        << "\" is reserved or not valid for certain "
           "CMake features, such as generator expressions, and may result "
           "in undefined behavior.";
      this->Makefile->IssueMessage(messageType, e.str());

      if (messageType == cmake::FATAL_ERROR) {
        return false;
      }
    }
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      this->SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      this->SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      this->SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      std::ostringstream e;
      e << "ALIAS requires exactly one target argument.";
      this->SetError(e.str());
      return false;
    }

    const char* aliasedName = s->c_str();
    if (this->Makefile->IsAlias(aliasedName)) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is itself an ALIAS.";
      this->SetError(e.str());
      return false;
    }
    cmTarget* aliasedTarget =
      this->Makefile->FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" does not already "
                          "exist.";
      this->SetError(e.str());
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is not a library.";
      this->SetError(e.str());
      return false;
    }
    if (aliasedTarget->IsImported()) {
      std::ostringstream e;
      e << "cannot create ALIAS target \"" << libName << "\" because target \""
        << aliasedName << "\" is IMPORTED.";
      this->SetError(e.str());
      return false;
    }
    this->Makefile->AddAlias(libName, aliasedName);
    return true;
  }

  if (importTarget && excludeFromAll) {
    this->SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !this->Makefile->GetState()->GetGlobalPropertyAsBool(
        "TARGET_SUPPORTS_SHARED_LIBS")) {
    std::ostringstream w;
    w << "ADD_LIBRARY called with "
      << (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE")
      << " option but the target platform does not support dynamic linking. "
         "Building a STATIC library instead. This may lead to problems.";
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      this->SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::OBJECT_LIBRARY) {
      std::string reason;
      if (!this->Makefile->GetGlobalGenerator()->HasKnownObjectFileLocation(
            &reason)) {
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          "The OBJECT library type may not be used for IMPORTED libraries" +
            reason + ".");
        return true;
      }
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        std::ostringstream e;
        e << "Invalid name for IMPORTED INTERFACE library target: " << libName;
        this->SetError(e.str());
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (this->Makefile->FindTargetToUse(libName)) {
      std::ostringstream e;
      e << "cannot create imported target \"" << libName
        << "\" because another target with the same name already exists.";
      this->SetError(e.str());
      return false;
    }

    // Create the imported target.
    this->Makefile->AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!this->Makefile->EnforceUniqueName(libName, msg)) {
      this->SetError(msg);
      return false;
    }
  }

  std::vector<std::string> srclists;

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      std::ostringstream e;
      e << "Invalid name for INTERFACE library target: " << libName;
      this->SetError(e.str());
      return false;
    }

    this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);
    return true;
  }

  if (s == args.end()) {
    std::string msg = "You have called ADD_LIBRARY for library ";
    msg += args[0];
    msg += " without any source files. This typically indicates a problem ";
    msg += "with your CMakeLists.txt file";
    cmSystemTools::Message(msg.c_str(), "Warning");
  }

  srclists.insert(srclists.end(), s, args.end());

  this->Makefile->AddLibrary(libName, type, srclists, excludeFromAll);

  return true;
}